

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

void Joy_GenerateButtonEvents(int oldbuttons,int newbuttons,int numbuttons,int *keys)

{
  int local_3c;
  uint local_38;
  int j;
  int mask;
  event_t ev;
  int changed;
  int *keys_local;
  int numbuttons_local;
  int newbuttons_local;
  int oldbuttons_local;
  
  ev.x = oldbuttons ^ newbuttons;
  if (ev.x != 0) {
    unique0x1000005e = keys;
    memset(&j,0,0x10);
    local_38 = 1;
    for (local_3c = 0; local_3c < numbuttons; local_3c = local_3c + 1) {
      if ((ev.x & local_38) != 0) {
        j._2_2_ = (undefined2)stack0xffffffffffffffe0[local_3c];
        j._0_1_ = 2;
        if ((newbuttons & local_38) != 0) {
          j._0_1_ = 1;
        }
        D_PostEvent((event_t *)&j);
      }
      local_38 = local_38 << 1;
    }
  }
  return;
}

Assistant:

void Joy_GenerateButtonEvents(int oldbuttons, int newbuttons, int numbuttons, const int *keys)
{
	int changed = oldbuttons ^ newbuttons;
	if (changed != 0)
	{
		event_t ev = { 0, 0, 0, 0, 0, 0, 0 };
		int mask = 1;
		for (int j = 0; j < numbuttons; mask <<= 1, ++j)
		{
			if (changed & mask)
			{
				ev.data1 = keys[j];
				ev.type = (newbuttons & mask) ? EV_KeyDown : EV_KeyUp;
				D_PostEvent(&ev);
			}
		}
	}
}